

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_update.c
# Opt level: O2

lu_int __thiscall lu_update(void *this,double xtbl)

{
  int iVar1;
  double stretch;
  undefined8 uVar2;
  uint nlines;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  lu_int *begin;
  lu_int *end;
  lu_int *next;
  lu_int *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  lu_int *index;
  double *value;
  lu_int *plVar10;
  lu_int *pstack;
  int iVar11;
  uint uVar12;
  int iVar13;
  lu_int lVar14;
  int iVar15;
  uint uVar16;
  lu_int lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined8 *puVar26;
  long lVar27;
  int *piVar28;
  uint uVar29;
  int iVar30;
  int *piVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  ulong uVar45;
  bool bVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  int *local_1c8;
  lu_int *local_118;
  lu_int ipivot;
  lu_int jpivot;
  double local_98;
  undefined8 uStack_90;
  ulong local_88;
  long local_80;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  nlines = *(uint *)((long)this + 0x54);
  lVar41 = (long)*(int *)((long)this + 0x68);
  iVar30 = *(int *)((long)this + 0x80);
  uVar29 = *(uint *)((long)this + 0x30);
  local_88 = (ulong)uVar29;
  stretch = *(double *)((long)this + 0x38);
  local_80 = *(long *)((long)this + 0x260);
  lVar37 = *(long *)((long)this + 0x270);
  local_38 = *(long *)((long)this + 0x1d8);
  local_40 = *(long *)((long)this + 0x1e8);
  lVar5 = *(long *)((long)this + 0x280);
  lVar34 = *(long *)((long)this + 0x1f8);
  begin = *(lu_int **)((long)this + 0x218);
  end = *(lu_int **)((long)this + 0x228);
  next = *(lu_int **)((long)this + 0x238);
  plVar6 = *(lu_int **)((long)this + 0x248);
  lVar38 = *(long *)((long)this + 0x2a8);
  lVar21 = *(long *)((long)this + 0x2b0);
  lVar27 = *(long *)((long)this + 0x1a0);
  lVar7 = *(long *)((long)this + 0x1b8);
  lVar8 = *(long *)((long)this + 0x1a8);
  lVar9 = *(long *)((long)this + 0x1c0);
  index = *(lu_int **)((long)this + 0x1b0);
  value = *(double **)((long)this + 0x1c8);
  plVar10 = *(lu_int **)((long)this + 0x290);
  local_1c8 = *(int **)((long)this + 0x210);
  pstack = *(lu_int **)((long)this + 0x2a0);
  iVar18 = *(int *)((long)this + 0x188);
  lVar22 = (long)iVar18;
  iVar3 = *(int *)(local_80 + lVar22 * 4);
  uVar39 = (ulong)iVar3;
  dVar50 = *(double *)(lVar38 + lVar22 * 8);
  lVar19 = (long)(int)nlines;
  uVar23 = (ulong)*(int *)(lVar5 + lVar19 * 4);
  lVar20 = uVar23 << 2;
  dVar51 = 0.0;
  bVar46 = false;
  while( true ) {
    iVar15 = *(int *)(lVar8 + lVar20);
    iVar44 = (int)uVar23;
    lVar33 = (long)iVar44;
    if (iVar15 < 0) break;
    if (iVar15 == iVar3) {
      dVar51 = *(double *)(lVar9 + lVar20 * 2);
      bVar46 = true;
    }
    else {
      *(int *)(lVar8 + lVar33 * 4) = iVar15;
      uVar23 = (ulong)(iVar44 + 1);
      *(undefined8 *)(lVar9 + lVar33 * 8) = *(undefined8 *)(lVar9 + lVar20 * 2);
    }
    lVar20 = lVar20 + 4;
  }
  if (bVar46) {
    *(int *)(lVar8 + lVar33 * 4) = iVar3;
    *(double *)(lVar9 + lVar33 * 8) = dVar51;
  }
  local_118 = local_1c8 + lVar19;
  iVar15 = *(int *)(lVar5 + lVar19 * 4);
  iVar13 = *(int *)(lVar34 + lVar41 * 4);
  iVar36 = *(int *)(lVar34 + 4 + lVar41 * 4);
  iVar11 = *(int *)((long)this + 0x18c) + 1;
  *(int *)((long)this + 0x18c) = iVar11;
  for (lVar20 = (long)*(int *)(lVar34 + lVar41 * 4); lVar20 < *(int *)(lVar34 + 4 + lVar41 * 4);
      lVar20 = lVar20 + 1) {
    lVar33 = (long)*(int *)(lVar27 + lVar20 * 4);
    plVar10[lVar33] = iVar11;
    *(undefined8 *)(pstack + lVar33 * 2) = *(undefined8 *)(lVar7 + lVar20 * 8);
  }
  iVar35 = iVar44 - iVar15;
  lVar33 = (long)*(int *)(lVar5 + lVar19 * 4);
  lVar42 = iVar35 + lVar33;
  iVar1 = 0;
  dVar52 = dVar51;
  for (lVar20 = lVar33; lVar20 < lVar42; lVar20 = lVar20 + 1) {
    lVar40 = (long)*(int *)(lVar8 + lVar20 * 4);
    if (plVar10[lVar40] == iVar11) {
      dVar52 = dVar52 - *(double *)(lVar9 + lVar20 * 8) * *(double *)(pstack + lVar40 * 2);
      iVar1 = iVar1 + 1;
    }
  }
  if ((dVar52 == 0.0) && (!NAN(dVar52))) {
    return -6;
  }
  local_98 = ABS(dVar52);
  uStack_90 = 0;
  if (local_98 < *(double *)((long)this + 0x18)) {
    return -6;
  }
  uVar12 = iVar36 - iVar13;
  dVar49 = (double)(int)uVar29;
  iVar13 = 0;
  for (; lVar33 < lVar42; lVar33 = lVar33 + 1) {
    iVar36 = *(int *)(lVar37 + (long)*(int *)(lVar8 + lVar33 * 4) * 4);
    if (end[iVar36] == begin[next[iVar36]]) {
      iVar36 = end[iVar36] - begin[iVar36];
      iVar13 = (int)((double)(iVar13 + iVar36 + 1) + (double)(iVar36 + 1) * stretch + dVar49);
    }
  }
  iVar36 = iVar13 - (end[lVar19] - begin[lVar19]);
  if (iVar36 != 0 && end[lVar19] - begin[lVar19] <= iVar13) {
    *(int *)((long)this + 0x60) = iVar36;
    return 1;
  }
  local_78 = ABS(dVar52 - xtbl * dVar50);
  uStack_70 = 0;
  iVar44 = (iVar30 - iVar15) + iVar44;
  ipivot = iVar3;
  jpivot = iVar18;
  for (piVar31 = (int *)((long)*(int *)(lVar5 + uVar39 * 4) * 4 + lVar8); -1 < (long)*piVar31;
      piVar31 = piVar31 + 1) {
    iVar30 = *(int *)(lVar37 + (long)*piVar31 * 4);
    iVar15 = end[iVar30];
    end[iVar30] = iVar15 + -1;
    lVar14 = find(iVar18,index,begin[iVar30],iVar15);
    index[lVar14] = index[(long)iVar15 + -1];
    value[lVar14] = value[(long)iVar15 + -1];
    iVar44 = iVar44 + -1;
  }
  for (piVar31 = (int *)((long)*(int *)(lVar5 + uVar39 * 4) * 4 + lVar8); -1 < *piVar31;
      piVar31 = piVar31 + 1) {
    *piVar31 = -1;
  }
  iVar30 = *(int *)(lVar5 + lVar19 * 4);
  *(int *)(lVar5 + uVar39 * 4) = iVar30;
  *(int *)(lVar5 + lVar19 * 4) = iVar30 + iVar35 + 1;
  *(undefined4 *)(lVar8 + (long)(iVar30 + iVar35) * 4) = 0xffffffff;
  for (lVar20 = (long)*(int *)(lVar5 + uVar39 * 4) << 2; -1 < (long)*(int *)(lVar8 + lVar20);
      lVar20 = lVar20 + 4) {
    iVar30 = *(int *)(lVar37 + (long)*(int *)(lVar8 + lVar20) * 4);
    lVar14 = end[iVar30];
    if (lVar14 == begin[next[iVar30]]) {
      lu_file_reappend(iVar30,nlines,begin,end,next,plVar6,index,value,
                       (int)((double)((lVar14 - begin[iVar30]) + 1) * stretch + 1.0 + dVar49));
      lVar14 = end[iVar30];
    }
    end[iVar30] = lVar14 + 1;
    index[lVar14] = iVar18;
    value[lVar14] = *(double *)(lVar9 + lVar20 * 2);
  }
  *(double *)(lVar38 + lVar22 * 8) = dVar51;
  *(double *)(lVar21 + uVar39 * 8) = dVar51;
  if (bVar46) {
    if (iVar1 == 0) {
      dVar50 = *(double *)((long)this + 0x90);
      dVar51 = fmin(*(double *)((long)this + 0x88),local_98);
      *(double *)((long)this + 0x88) = dVar51;
      dVar50 = fmax(dVar50,local_98);
      *(double *)((long)this + 0x90) = dVar50;
      *local_1c8 = iVar3;
      local_1c8[lVar19] = iVar18;
      iVar30 = *(int *)(lVar34 + lVar41 * 4);
      uVar39 = 0;
      uVar23 = 0;
      if (0 < (int)uVar12) {
        uVar23 = (ulong)uVar12;
      }
      for (; uVar23 != uVar39; uVar39 = uVar39 + 1) {
        iVar18 = *(int *)(lVar27 + (long)iVar30 * 4 + uVar39 * 4);
        local_1c8[uVar39 + 1] = iVar18;
        local_1c8[lVar19 + uVar39 + 1] = *(int *)(lVar37 + (long)iVar18 * 4);
      }
      uVar29 = uVar12 + 1;
      *(int *)((long)this + 0x78) = *(int *)((long)this + 0x78) + 1;
      goto LAB_00398738;
    }
  }
  else {
    *local_118 = iVar18;
    lVar20 = 0;
    uVar45 = 1;
    bVar46 = false;
    uVar23 = uVar39;
    while ((lVar20 < (int)uVar45 && (!bVar46))) {
      uVar29 = local_118[lVar20];
      uVar23 = (ulong)uVar29;
      for (lVar33 = (long)begin[(int)uVar29]; lVar33 < end[(int)uVar29]; lVar33 = lVar33 + 1) {
        iVar30 = index[lVar33];
        bVar46 = true;
        if (iVar30 == iVar18) goto LAB_00397fa2;
        if (-1 < plVar10[iVar30]) {
          plVar10[iVar30] = ~uVar29;
          iVar15 = (int)uVar45;
          uVar45 = (ulong)(iVar15 + 1);
          local_118[iVar15] = iVar30;
        }
      }
      bVar46 = false;
LAB_00397fa2:
      lVar20 = lVar20 + 1;
    }
    uVar29 = nlines;
    if (bVar46) {
      piVar31 = local_1c8 + lVar19;
      while( true ) {
        uVar29 = uVar29 - 1;
        piVar31 = piVar31 + -1;
        iVar30 = (int)uVar23;
        if (iVar30 == iVar18) break;
        *piVar31 = iVar30;
        uVar23 = (ulong)(uint)~plVar10[iVar30];
      }
      local_1c8[(int)uVar29] = iVar18;
    }
    uVar23 = 0;
    if ((int)uVar45 < 1) {
      uVar45 = 0;
    }
    for (; uVar45 != uVar23; uVar23 = uVar23 + 1) {
      plVar10[local_118[uVar23]] = 0;
    }
    iVar30 = *(int *)((long)this + 0x18c) + 1;
    *(int *)((long)this + 0x18c) = iVar30;
    lVar33 = (long)(int)uVar29;
    bVar46 = true;
    uVar23 = (ulong)nlines;
    lVar20 = lVar33;
    while ((lVar20 < lVar19 + -1 && (bVar46))) {
      iVar15 = local_1c8[lVar20];
      iVar13 = local_1c8[lVar20 + 1];
      lVar20 = lVar20 + 1;
      lVar14 = find(iVar13,index,begin[iVar15],end[iVar15]);
      index[lVar14] = iVar15;
      uVar16 = lu_dfs(iVar15,begin,end,index,(lu_int)uVar23,local_118,pstack,plVar10,iVar30);
      uVar23 = (ulong)uVar16;
      local_118[(int)uVar16] = iVar13;
      index[lVar14] = iVar13;
      bVar46 = plVar10[iVar13] != iVar30;
    }
    if (bVar46) {
      lVar14 = local_1c8[lVar19 + -1];
      lVar17 = lu_dfs(lVar14,begin,end,index,(lu_int)uVar23,local_118,pstack,plVar10,iVar30);
      local_48 = (long)lVar17;
      local_118 = local_118 + local_48;
      *local_118 = iVar18;
      iVar18 = plVar10[lVar14];
      plVar10[lVar14] = iVar18 + -1;
      bVar46 = true;
      for (piVar31 = (int *)(lVar8 + (long)*(int *)(lVar5 + uVar39 * 4) * 4); -1 < (long)*piVar31;
          piVar31 = piVar31 + 1) {
        if (plVar10[*(int *)(lVar37 + (long)*piVar31 * 4)] == iVar30) {
          bVar46 = false;
        }
      }
      plVar10[lVar14] = iVar18;
      if (bVar46) {
        uVar29 = ~uVar29 + nlines;
        piVar31 = local_1c8 + lVar33;
        lVar37 = *(long *)((long)this + 0x260);
        lVar34 = *(long *)((long)this + 0x270);
        lVar38 = *(long *)((long)this + 0x280);
        lVar21 = *(long *)((long)this + 0x218);
        lVar27 = *(long *)((long)this + 0x228);
        lVar7 = *(long *)((long)this + 0x238);
        lVar20 = *(long *)((long)this + 0x248);
        lVar22 = *(long *)((long)this + 0x2a8);
        lVar41 = *(long *)((long)this + 0x2b0);
        plVar6 = *(lu_int **)((long)this + 0x1a8);
        iVar30 = *piVar31;
        local_60 = (long)piVar31[(int)uVar29];
        lVar24 = (long)iVar30;
        local_50 = (long)*(int *)(lVar37 + local_60 * 4);
        local_68 = *(undefined8 *)(lVar22 + local_60 * 8);
        plVar10 = *(lu_int **)((long)this + 0x1b0);
        lVar42 = *(long *)((long)this + 0x1c0);
        lVar40 = *(long *)((long)this + 0x1c8);
        local_58 = (long)*(int *)(lVar37 + lVar24 * 4);
        uVar4 = *(undefined4 *)(lVar21 + local_60 * 4);
        lVar14 = *(lu_int *)(lVar27 + local_60 * 4);
        uVar39 = (ulong)uVar29;
        for (uVar23 = uVar39; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          iVar18 = piVar31[uVar23 - 1];
          iVar3 = piVar31[uVar23];
          lVar32 = (long)iVar18;
          lVar43 = (long)iVar3;
          *(undefined4 *)(lVar21 + lVar43 * 4) = *(undefined4 *)(lVar21 + lVar32 * 4);
          *(undefined4 *)(lVar27 + lVar43 * 4) = *(undefined4 *)(lVar27 + lVar32 * 4);
          iVar15 = *(int *)(lVar7 + lVar43 * 4);
          iVar13 = *(int *)(lVar7 + lVar32 * 4);
          iVar36 = *(int *)(lVar20 + lVar43 * 4);
          if (iVar15 == iVar18) {
            *(int *)(lVar7 + lVar32 * 4) = iVar3;
            *(int *)(lVar20 + lVar43 * 4) = iVar18;
            *(int *)(lVar7 + (long)iVar36 * 4) = iVar18;
            *(int *)(lVar20 + lVar32 * 4) = iVar36;
            *(int *)(lVar7 + lVar43 * 4) = iVar13;
            *(int *)(lVar20 + (long)iVar13 * 4) = iVar3;
          }
          else {
            iVar11 = *(int *)(lVar20 + lVar32 * 4);
            if (iVar13 == iVar3) {
              *(int *)(lVar7 + lVar43 * 4) = iVar18;
              *(int *)(lVar20 + lVar32 * 4) = iVar3;
              *(int *)(lVar7 + lVar32 * 4) = iVar15;
              *(int *)(lVar20 + (long)iVar15 * 4) = iVar18;
              *(int *)(lVar7 + (long)iVar11 * 4) = iVar3;
              *(int *)(lVar20 + lVar43 * 4) = iVar11;
            }
            else {
              *(int *)(lVar7 + lVar32 * 4) = iVar15;
              *(int *)(lVar20 + (long)iVar15 * 4) = iVar18;
              *(int *)(lVar7 + (long)iVar11 * 4) = iVar3;
              *(int *)(lVar20 + lVar43 * 4) = iVar11;
              *(int *)(lVar7 + (long)iVar36 * 4) = iVar18;
              *(int *)(lVar20 + lVar32 * 4) = iVar36;
              *(int *)(lVar7 + lVar43 * 4) = iVar13;
              *(int *)(lVar20 + (long)iVar13 * 4) = iVar3;
            }
          }
          iVar15 = *(int *)(lVar27 + lVar43 * 4);
          lVar17 = find(iVar3,plVar10,*(lu_int *)(lVar21 + lVar43 * 4),iVar15);
          lVar25 = (long)lVar17;
          if (uVar23 == 1) {
            uVar2 = *(undefined8 *)(lVar40 + lVar25 * 8);
            uVar47 = (undefined4)uVar2;
            uVar48 = (undefined4)((ulong)uVar2 >> 0x20);
            *(int *)(lVar27 + lVar43 * 4) = iVar15 + -1;
            plVar10[lVar25] = plVar10[(long)iVar15 + -1];
            puVar26 = (undefined8 *)(lVar40 + (long)*(int *)(lVar27 + lVar43 * 4) * 8);
          }
          else {
            plVar10[lVar25] = iVar18;
            uVar2 = *(undefined8 *)(lVar40 + lVar25 * 8);
            uVar47 = (undefined4)uVar2;
            uVar48 = (undefined4)((ulong)uVar2 >> 0x20);
            puVar26 = (undefined8 *)(lVar22 + lVar32 * 8);
          }
          *(ulong *)(lVar22 + lVar43 * 8) = CONCAT44(uVar48,uVar47);
          *(undefined8 *)(lVar40 + lVar25 * 8) = *puVar26;
          dVar50 = *(double *)((long)this + 0x90);
          dVar51 = fmin(*(double *)((long)this + 0x88),ABS(*(double *)(lVar22 + lVar43 * 8)));
          *(double *)((long)this + 0x88) = dVar51;
          dVar50 = fmax(dVar50,ABS(*(double *)(lVar22 + lVar43 * 8)));
          *(double *)((long)this + 0x90) = dVar50;
        }
        *(undefined4 *)(lVar21 + lVar24 * 4) = uVar4;
        *(lu_int *)(lVar27 + lVar24 * 4) = lVar14;
        lVar14 = find(iVar30,plVar10,*(lu_int *)(lVar21 + lVar24 * 4),lVar14);
        lVar21 = (long)lVar14;
        plVar10[lVar21] = (lu_int)local_60;
        *(undefined8 *)(lVar22 + lVar24 * 8) = *(undefined8 *)(lVar40 + lVar21 * 8);
        *(undefined8 *)(lVar40 + lVar21 * 8) = local_68;
        dVar50 = *(double *)((long)this + 0x90);
        dVar51 = fmin(*(double *)((long)this + 0x88),ABS(*(double *)(lVar22 + lVar24 * 8)));
        *(double *)((long)this + 0x88) = dVar51;
        dVar50 = fmax(dVar50,ABS(*(double *)(lVar22 + lVar24 * 8)));
        *(double *)((long)this + 0x90) = dVar50;
        lVar14 = *(lu_int *)(lVar38 + local_58 * 4);
        uVar45 = 0;
        uVar23 = 0;
        if (0 < (int)uVar29) {
          uVar23 = uVar39;
        }
        for (; lVar21 = local_50, uVar23 != uVar45; uVar45 = uVar45 + 1) {
          iVar18 = *(int *)(lVar37 + (long)local_1c8[lVar33 + uVar45] * 4);
          iVar3 = *(int *)(lVar37 + (long)local_1c8[lVar33 + uVar45 + 1] * 4);
          lVar17 = *(lu_int *)(lVar38 + (long)iVar3 * 4);
          *(lu_int *)(lVar38 + (long)iVar18 * 4) = lVar17;
          lVar17 = find(iVar18,plVar6,lVar17,-1);
          lVar21 = (long)lVar17;
          plVar6[lVar21] = iVar3;
          *(undefined8 *)(lVar41 + (long)iVar18 * 8) = *(undefined8 *)(lVar42 + lVar21 * 8);
          *(undefined8 *)(lVar42 + lVar21 * 8) = *(undefined8 *)(lVar41 + (long)iVar3 * 8);
        }
        *(lu_int *)(lVar38 + local_50 * 4) = lVar14;
        lVar17 = (lu_int)local_50;
        lVar14 = find(lVar17,plVar6,lVar14,-1);
        lVar38 = (long)lVar14;
        *(undefined8 *)(lVar41 + lVar21 * 8) = *(undefined8 *)(lVar42 + lVar38 * 8);
        lVar27 = (lVar38 << 0x20) + -0x200000000;
        piVar28 = plVar6 + lVar38;
        do {
          lVar27 = lVar27 + 0x100000000;
          iVar18 = *piVar28;
          piVar28 = piVar28 + 1;
        } while (-1 < iVar18);
        plVar6[lVar38] = *(lu_int *)((long)plVar6 + (lVar27 >> 0x1e));
        *(undefined8 *)(lVar42 + lVar38 * 8) = *(undefined8 *)(lVar42 + (lVar27 >> 0x1d));
        *(undefined4 *)((long)plVar6 + (lVar27 >> 0x1e)) = 0xffffffff;
        for (; 0 < (int)uVar39; uVar39 = uVar39 - 1) {
          iVar18 = piVar31[uVar39];
          iVar3 = *(int *)(lVar37 + (long)piVar31[uVar39 - 1] * 4);
          *(int *)(lVar37 + (long)iVar18 * 4) = iVar3;
          *(int *)(lVar34 + (long)iVar3 * 4) = iVar18;
        }
        *(lu_int *)(lVar37 + lVar24 * 4) = lVar17;
        *(int *)(lVar34 + lVar21 * 4) = iVar30;
        local_1c8 = local_1c8 + local_48;
        uVar29 = nlines - (int)local_48;
        uVar23 = 0;
        piVar31 = local_1c8;
        if (0 < (int)uVar29) {
          uVar23 = (ulong)uVar29;
        }
        while (uVar23 != 0) {
          *piVar31 = *(int *)(local_80 + (long)piVar31[lVar19] * 4);
          uVar23 = uVar23 - 1;
          piVar31 = piVar31 + 1;
        }
        iVar44 = iVar44 + -1;
        goto LAB_00398738;
      }
    }
  }
  for (lVar37 = (long)begin[lVar22]; lVar37 < end[lVar22]; lVar37 = lVar37 + 1) {
    uVar23 = (ulong)*(int *)(lVar5 + (long)*(int *)(local_80 + (long)index[lVar37] * 4) * 4);
    lVar20 = (uVar23 << 0x20) + -0x100000000;
    uVar45 = 0xffffffff;
    for (piVar31 = (int *)(lVar8 + uVar23 * 4); -1 < *piVar31; piVar31 = piVar31 + 1) {
      if (*piVar31 == iVar3) {
        uVar45 = uVar23 & 0xffffffff;
      }
      lVar20 = lVar20 + 0x100000000;
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    *(undefined4 *)(lVar8 + (long)(int)uVar45 * 4) = *(undefined4 *)(lVar8 + (lVar20 >> 0x1e));
    *(undefined8 *)(lVar9 + (long)(int)uVar45 * 8) = *(undefined8 *)(lVar9 + (lVar20 >> 0x1d));
    *(undefined4 *)(lVar8 + (lVar20 >> 0x1e)) = 0xffffffff;
    iVar44 = iVar44 + -1;
  }
  end[lVar22] = begin[lVar22];
  *(double *)(lVar38 + lVar22 * 8) = dVar52;
  *(double *)(lVar21 + uVar39 * 8) = dVar52;
  dVar50 = *(double *)((long)this + 0x90);
  dVar51 = fmin(*(double *)((long)this + 0x88),local_98);
  *(double *)((long)this + 0x88) = dVar51;
  dVar50 = fmax(dVar50,local_98);
  *(double *)((long)this + 0x90) = dVar50;
  iVar30 = *(int *)(lVar34 + lVar41 * 4);
  iVar18 = 0;
  dVar50 = 0.0;
  for (lVar37 = (long)iVar30; lVar37 < *(int *)(lVar34 + 4 + lVar41 * 4); lVar37 = lVar37 + 1) {
    dVar51 = *(double *)(lVar7 + lVar37 * 8);
    if ((dVar51 != 0.0) || (NAN(dVar51))) {
      dVar50 = fmax(dVar50,ABS(dVar51));
      lVar38 = (long)iVar30;
      *(undefined4 *)(lVar27 + lVar38 * 4) = *(undefined4 *)(lVar27 + lVar37 * 4);
      iVar30 = iVar30 + 1;
      *(double *)(lVar7 + lVar38 * 8) = dVar51;
      iVar18 = iVar18 + 1;
    }
  }
  *(int *)(lVar34 + 4 + lVar41 * 4) = iVar30;
  *(int *)((long)this + 0x84) = *(int *)((long)this + 0x84) + iVar18;
  dVar50 = fmax(*(double *)((long)this + 0x98),dVar50);
  *(double *)((long)this + 0x98) = dVar50;
  *(int *)((long)this + 0x68) = *(int *)((long)this + 0x68) + 1;
  *(int *)((long)this + 0x74) = *(int *)((long)this + 0x74) + 1;
  local_1c8 = &ipivot;
  local_118 = &jpivot;
  uVar29 = 1;
LAB_00398738:
  iVar30 = *(int *)((long)this + 400);
  iVar18 = iVar30 + uVar29;
  if (iVar18 != nlines * 2 && SBORROW4(iVar18,nlines * 2) == (int)(iVar18 + nlines * -2) < 0) {
    lu_garbage_perm(this);
    iVar30 = *(int *)((long)this + 400);
  }
  uVar39 = 0;
  uVar23 = 0;
  if (0 < (int)uVar29) {
    uVar23 = (ulong)uVar29;
  }
  for (; uVar23 != uVar39; uVar39 = uVar39 + 1) {
    *(int *)(local_40 + (long)iVar30 * 4 + uVar39 * 4) = local_1c8[uVar39];
  }
  iVar30 = *(int *)((long)this + 400);
  for (uVar39 = 0; uVar23 != uVar39; uVar39 = uVar39 + 1) {
    *(lu_int *)(local_38 + (long)iVar30 * 4 + uVar39 * 4) = local_118[uVar39];
  }
  *(int *)((long)this + 400) = *(int *)((long)this + 400) + uVar29;
  iVar30 = *(int *)(lVar5 + lVar19 * 4);
  dVar50 = *(double *)((long)this + 0x40);
  if ((double)iVar30 * dVar50 < (double)(int)((iVar30 - iVar44) - nlines)) {
    uVar39 = 0;
    uVar23 = 0;
    if (0 < (int)nlines) {
      uVar23 = (ulong)nlines;
    }
    iVar18 = -2;
    for (; uVar23 != uVar39; uVar39 = uVar39 + 1) {
      lVar37 = (long)*(int *)(lVar5 + uVar39 * 4);
      iVar3 = *(int *)(lVar8 + lVar37 * 4);
      if (iVar3 == -1) {
        *(undefined4 *)(lVar5 + uVar39 * 4) = 0;
      }
      else {
        *(int *)(lVar5 + uVar39 * 4) = iVar3;
        *(int *)(lVar8 + lVar37 * 4) = iVar18;
      }
      iVar18 = iVar18 + -1;
    }
    iVar18 = 1;
    lVar34 = 0xffffffff;
    for (lVar37 = 1; lVar37 < iVar30; lVar37 = lVar37 + 1) {
      uVar29 = *(uint *)(lVar8 + lVar37 * 4);
      lVar38 = (long)iVar18;
      if ((int)uVar29 < 0) {
        if (uVar29 != 0xffffffff) {
          lVar34 = 0xfffffffe - (ulong)uVar29;
          *(undefined4 *)(lVar8 + lVar38 * 4) = *(undefined4 *)(lVar5 + lVar34 * 4);
          *(int *)(lVar5 + lVar34 * 4) = iVar18;
          goto LAB_0039888c;
        }
        if (-1 < (int)lVar34) {
          iVar18 = iVar18 + 1;
          *(undefined4 *)(lVar8 + lVar38 * 4) = 0xffffffff;
        }
        lVar34 = 0xffffffff;
      }
      else {
        *(uint *)(lVar8 + lVar38 * 4) = uVar29;
LAB_0039888c:
        iVar18 = iVar18 + 1;
        *(undefined8 *)(lVar9 + lVar38 * 8) = *(undefined8 *)(lVar9 + lVar37 * 8);
      }
    }
    *(int *)(lVar5 + lVar19 * 4) = iVar18;
    dVar50 = *(double *)((long)this + 0x40);
  }
  if ((double)begin[lVar19] * dVar50 <
      (double)(begin[lVar19] -
              (int)((double)(int)((int)local_88 * nlines) +
                   stretch * (double)iVar44 + (double)iVar44))) {
    lu_file_compress(nlines,begin,end,next,index,value,stretch,(int)local_88);
  }
  *(double *)((long)this + 0x170) = local_78 / (local_98 + 1.0);
  *(int *)((long)this + 0x80) = iVar44;
  *(undefined8 *)((long)this + 0x184) = 0xffffffffffffffff;
  *(double *)((long)this + 0xa0) = (double)(int)uVar12 + *(double *)((long)this + 0xa0);
  *(int *)((long)this + 100) = *(int *)((long)this + 100) + 1;
  *(int *)((long)this + 0x70) = *(int *)((long)this + 0x70) + 1;
  return 0;
}

Assistant:

lu_int lu_update(struct lu *this, double xtbl)
{
    const lu_int m          = this->m;
    const lu_int nforrest   = this->nforrest;
    lu_int Unz              = this->Unz;
    const lu_int pad        = this->pad;
    const double stretch    = this->stretch;
    lu_int *pmap            = this->pmap;
    lu_int *qmap            = this->qmap;
    lu_int *pivotcol        = this->pivotcol;
    lu_int *pivotrow        = this->pivotrow;
    lu_int *Ubegin          = this->Ubegin;
    lu_int *Rbegin          = this->Rbegin;
    lu_int *Wbegin          = this->Wbegin;
    lu_int *Wend            = this->Wend;
    lu_int *Wflink          = this->Wflink;
    lu_int *Wblink          = this->Wblink;
    double *col_pivot       = this->col_pivot;
    double *row_pivot       = this->row_pivot;
    lu_int *Lindex          = this->Lindex;
    double *Lvalue          = this->Lvalue;
    lu_int *Uindex          = this->Uindex;
    double *Uvalue          = this->Uvalue;
    lu_int *Windex          = this->Windex;
    double *Wvalue          = this->Wvalue;
    lu_int *marked          = this->marked;
    lu_int *iwork1          = this->iwork1;
    lu_int *iwork2          = iwork1 + m;
    double *work1           = this->work1;

    lu_int jpivot = this->btran_for_update;
    lu_int ipivot = pmap[jpivot];
    double oldpiv = col_pivot[jpivot];
    lu_int status = BASICLU_OK;

    lu_int i, j, jnext, n, nz, t, put, pos, end, where, room, grow, used,need,M;
    lu_int have_diag, intersect, istriangular, nz_roweta, nz_spike;
    lu_int nreach, *col_reach, *row_reach;
    double spike_diag, newpiv, piverr;

    assert(nforrest < m);

    /*
     * Note: If the singularity test fails or memory is insufficient, then the
     *       update is aborted and the user may call this routine a second time.
     *       Changes made to data structures in the first call must not violate
     *       the logic in the second call.
     */

    /* ------- */
    /* Prepare */
    /* ------- */

    /* if present, move diagonal element to end of spike */
    spike_diag = 0.0;
    have_diag = 0;
    put = Ubegin[m];
    for (pos = put; (i = Uindex[pos]) >= 0; pos++)
    {
        if (i != ipivot)
        {
            Uindex[put] = i;
            Uvalue[put++] = Uvalue[pos];
        }
        else
        {
            spike_diag = Uvalue[pos];
            have_diag = 1;
        }
    }
    if (have_diag)
    {
        Uindex[put] = ipivot;
        Uvalue[put] = spike_diag;
    }
    nz_spike = put - Ubegin[m]; /* nz excluding diagonal */

    nz_roweta = Rbegin[nforrest+1] - Rbegin[nforrest];

    /* ------------- */
    /* Compute pivot */
    /* ------------- */

    /*
     * newpiv is the diagonal element in the spike column after the
     * Forrest-Tomlin update has been applied. It can be computed as
     *
     *    newpiv = spike_diag - dot(spike,row eta)                (1)
     * or
     *    newpiv = xtbl * oldpiv,                                 (2)
     *
     * where spike_diag is the diagonal element in the spike column
     * before the Forrest-Tomlin update and oldpiv was the pivot element
     * in column jpivot before inserting the spike. This routine uses
     * newpiv from (1) and reports the difference to (2) to the user
     * to monitor numerical stability.
     *
     * While computing (1), count intersection of patterns of spike and
     * row eta.
     */

    /* scatter row eta into work1 and mark positions */
    M = ++this->marker;
    for (pos = Rbegin[nforrest]; pos < Rbegin[nforrest+1]; pos++)
    {
        i = Lindex[pos];
        marked[i] = M;
        work1[i] = Lvalue[pos];
    }

    /* compute newpiv and count intersection */
    newpiv = spike_diag;
    intersect = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        if (marked[i] == M)
        {
            newpiv -= Uvalue[pos] * work1[i];
            intersect++;
        }
    }

    /* singularity test */
    if (newpiv == 0 || fabs(newpiv) < this->abstol)
    {
        status = BASICLU_ERROR_singular_update;
        return status;
    }

    /* stability measure */
    piverr = fabs(newpiv - xtbl*oldpiv);

    /* ------------ */
    /* Insert spike */
    /* ------------ */

    /* calculate bound on file growth */
    grow = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            grow += nz+1;                 /* row including spike entry */
            grow += stretch*(nz+1) + pad; /* extra room */
        }
    }

    /* reallocate if necessary */
    room = Wend[m] - Wbegin[m];
    if (grow > room)
    {
        this->addmemW = grow-room;
        status = BASICLU_REALLOCATE;
        return status;
    }

    /* remove column jpivot from row file */
    nz = 0;
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        end = Wend[j]--;
        where = find(jpivot, Windex, Wbegin[j], end);
        assert(where < end);
        Windex[where] = Windex[end-1];
        Wvalue[where] = Wvalue[end-1];
        nz++;
    }
    Unz -= nz;

    /* erase column jpivot in column file */
    for (pos = Ubegin[ipivot]; Uindex[pos] >= 0; pos++)
    {
        Uindex[pos] = GAP;
    }

    /* set column pointers to spike, chop off diagonal */
    Ubegin[ipivot] = Ubegin[m];
    Ubegin[m] += nz_spike;
    Uindex[Ubegin[m]++] = GAP;

    /* insert spike into row file */
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            room = 1 + stretch*(nz+1) + pad;
            lu_file_reappend(j, m, Wbegin, Wend, Wflink, Wblink, Windex,
                             Wvalue, room);
        }
        end = Wend[j]++;
        Windex[end] = jpivot;
        Wvalue[end] = Uvalue[pos];
    }
    Unz += nz_spike;

    /* insert diagonal */
    col_pivot[jpivot] = spike_diag;
    row_pivot[ipivot] = spike_diag;

    /* ------------------ */
    /* Test triangularity */
    /* ------------------ */

    row_reach = NULL;
    col_reach = NULL;

    if (have_diag)
    {
        /*
         * When the spike has a nonzero diagonal element, then the spiked matrix
         * is (symmetrically) permuted triangular if and only if reach(ipivot)
         * does not intersect with the spike pattern except for ipivot. Since
         * reach(ipivot) \ {ipivot} is the structural pattern of the row eta,
         * the matrix is permuted triangular iff the patterns of the row eta
         * and the spike do not intersect.
         *
         * To update the permutations below, we have to provide reach(ipivot)
         * and the associated column indices in topological order as arrays
         * row_reach[0..nreach-1] and col_reach[0..nreach-1]. Because the
         * pattern of the row eta was computed by a dfs, we obtain row_reach
         * simply by adding ipivot to the front. col_reach can then be obtained
         * through qmap.
         */
        istriangular = intersect == 0;
        if (istriangular)
        {
            this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
            this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

            /* build row_reach and col_reach in topological order */
            nreach = nz_roweta + 1;
            row_reach = iwork1;
            col_reach = iwork2;
            row_reach[0] = ipivot;
            col_reach[0] = jpivot;
            pos = Rbegin[nforrest];
            for (n = 1; n < nreach; n++)
            {
                i = Lindex[pos++];
                row_reach[n] = i;
                col_reach[n] = qmap[i];
            }
            this->nsymperm_total++;
        }
    }
    else
    {
        /*
         * The spike has a zero diagonal element, so the spiked matrix may only
         * be the *un*symmetric permutation of an upper triangular matrix.
         *
         * Part 1:
         *
         * Find an augmenting path in U[pmap,:] starting from jpivot.
         * An augmenting path is a sequence of column indices such that there
         * is an edge from each node to the next, and an edge from the final
         * node back to jpivot.
         *
         * bfs_path computes such a path in path[top..m-1].
         *
         * Because jpivot has no self-edge, the path must have at least two
         * nodes. The path must exist because otherwise the spiked matrix was
         * structurally singular and the singularity test above had failed.
         */
        lu_int *path = iwork1, top;
        lu_int *reach = iwork2, rtop;
        lu_int *pstack = (void *) work1;

        top = bfs_path(m, jpivot, Wbegin, Wend, Windex, path, marked, iwork2);
        assert(top < m-1);
        assert(path[top] == jpivot);

        /*
         * Part 2a:
         *
         * For each path index j (except the final one) mark the nodes in
         * reach(j), where the reach is computed in U[pmap,:] without the path
         * edges. If a path index is contained in the reach of an index that
         * comes before it in the path, then U is not permuted triangular.
         *
         * At the same time assemble the combined reach of all path nodes
         * (except the final one) in U[pmap_new,:], where pmap_new is the
         * column-row mapping after applying the permutation associated with
         * the augmenting path. We only have to replace each index where the
         * dfs starts by the next index in the path. The combined reach is
         * then assembled in topological order in
         *
         *    reach[rtop..m-1].
         */
        istriangular = 1;
        rtop = m;
        M = ++this->marker;
        for (t = top; t < m-1 && istriangular; t++)
        {
            j = path[t];
            jnext = path[t+1];
            where = find(jnext, Windex, Wbegin[j], Wend[j]);
            assert(where < Wend[j]);
            Windex[where] = j;  /* take out for a moment */
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jnext;
            Windex[where] = jnext; /* restore */
            istriangular = marked[jnext] != M;
        }

        /*
         * Part 2b:
         *
         * If the matrix looks triangular so far, then also mark the reach of
         * the final path node, which is reach(jpivot) in U[pmap_new,:].
         * U is then permuted triangular iff the combined reach does not
         * intersect the spike pattern except in the final path index.
         */
        if (istriangular)
        {
            j = path[m-1];
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jpivot;
            marked[j]--;        /* unmark for a moment */
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                if (marked[qmap[i]] == M) istriangular = 0;
            }
            marked[j]++;        /* restore */
        }

        /*
         * If U is permuted triangular, then permute to zero-free diagonal.
         * Set up row_reach[0..nreach-1] and col_reach[0..nreach-1] for
         * updating the permutations below. The column reach is the combined
         * reach of the path nodes. The row reach is given through pmap.
         */
        if (istriangular)
        {
            lu_int nswap = m-top-1;
            permute(this, path+top, nswap);
            Unz--;
            assert(reach[rtop] == jpivot);
            col_reach = reach + rtop; /* stored in iwork2 */
            row_reach = iwork1 + rtop;
            nreach = m-rtop;
            for (n = 0; n < nreach; n++)
            {
                row_reach[n] = pmap[col_reach[n]];
            }
        }
    }

    /* --------------------- */
    /* Forrest-Tomlin update */
    /* --------------------- */

    if (!istriangular)
    {
        /* remove row ipivot from column file */
        for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
        {
            j = Windex[pos];
            assert(j != jpivot);
            where = -1;
            for (end = Ubegin[pmap[j]]; (i = Uindex[end]) >= 0; end++)
            {
                if (i == ipivot) where = end;
            }
            assert(where >= 0);
            Uindex[where] = Uindex[end-1];
            Uvalue[where] = Uvalue[end-1];
            Uindex[end-1] = -1;
            Unz--;
        }

        /* remove row ipivot from row file */
        Wend[jpivot] = Wbegin[jpivot];

        /* replace pivot */
        col_pivot[jpivot] = newpiv;
        row_pivot[ipivot] = newpiv;
        this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
        this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

        /* drop zeros from row eta; update max entry of row etas */
        nz = 0;
        put = Rbegin[nforrest];
        double max_eta = 0;
        for (pos = put; pos < Rbegin[nforrest+1]; pos++)
        {
            if (Lvalue[pos])
            {
                max_eta = fmax(max_eta, fabs(Lvalue[pos]));
                Lindex[put] = Lindex[pos];
                Lvalue[put++] = Lvalue[pos];
                nz++;
            }
        }
        Rbegin[nforrest+1] = put;
        this->Rnz += nz;
        this->max_eta = fmax(this->max_eta, max_eta);

        /* prepare permutation update */
        nreach = 1;
        row_reach = &ipivot;
        col_reach = &jpivot;
        this->nforrest++;
        this->nforrest_total++;
    }

    /* ------------------- */
    /* Update permutations */
    /* ------------------- */

    if (this->pivotlen + nreach > 2*m)
    {
        lu_garbage_perm(this);
    }

    /* append row indices row_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotrow[put++] = row_reach[n];

    /* append col indices col_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotcol[put++] = col_reach[n];

    this->pivotlen += nreach;

    /* -------- */
    /* Clean up */
    /* -------- */

    /* compress U if used memory is shrinked sufficiently */
    used = Ubegin[m];
    if (used-Unz-m > this->compress_thres * used)
    {
        nz = compress_packed(m, Ubegin, Uindex, Uvalue);
        assert(nz == Unz);
    }

    /* compress W if used memory is shrinked sufficiently */
    used = Wbegin[m];
    need = Unz + stretch*Unz + m*pad;
    if ((used-need) > this->compress_thres * used)
    {
        nz = lu_file_compress(m, Wbegin, Wend, Wflink, Windex, Wvalue,
                              stretch, pad);
        assert(nz == Unz);
    }

    this->pivot_error = piverr / (1.0 + fabs(newpiv));
    this->Unz = Unz;
    this->btran_for_update = -1;
    this->ftran_for_update = -1;
    this->update_cost_numer += nz_roweta;
    this->nupdate++;
    this->nupdate_total++;

    #ifdef DEBUG_EXTRA
    {
        lu_int col, row;
        check_consistency(this, &col, &row);
        assert(col < 0 && row < 0);
    }
    #endif
    return status;
}